

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

void addstr2buff(BuffFS *buff,char *str,size_t slen)

{
  int iVar1;
  
  iVar1 = buff->blen;
  if (slen < 200) {
    if (199 - iVar1 < (int)slen) {
      pushstr(buff,buff->space,(long)iVar1);
      buff->blen = 0;
      iVar1 = 0;
    }
    memcpy(buff->space + iVar1,str,slen);
    buff->blen = buff->blen + (int)slen;
    return;
  }
  pushstr(buff,buff->space,(long)iVar1);
  buff->blen = 0;
  pushstr(buff,str,slen);
  return;
}

Assistant:

static void addstr2buff (BuffFS *buff, const char *str, size_t slen) {
  if (slen <= BUFVFS) {  /* does string fit into buffer? */
    char *bf = getbuff(buff, cast_int(slen));
    memcpy(bf, str, slen);  /* add string to buffer */
    addsize(buff, cast_int(slen));
  }
  else {  /* string larger than buffer */
    clearbuff(buff);  /* string comes after buffer's content */
    pushstr(buff, str, slen);  /* push string */
  }
}